

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Info.cpp
# Opt level: O0

int Assimp_Info(char **params,uint num)

{
  uint uVar1;
  aiMesh *paVar2;
  bool verbose_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  aiScene *scene_00;
  undefined8 uVar6;
  char *pcVar7;
  uint local_b38 [2];
  uint local_b30;
  uint local_b28;
  uint local_b20;
  uint local_b18;
  uint local_b10;
  uint local_b08;
  uint local_b00;
  undefined8 local_af8;
  uint local_af0;
  uint local_ae8;
  double local_ae0;
  aiNode *local_ad0;
  allocator<char> *local_ac8;
  aiReturn local_abc;
  aiString *local_ab8;
  aiReturn local_ab0;
  uint local_aac;
  char *local_aa8;
  undefined1 *local_aa0;
  double local_a98;
  float *local_a90;
  double local_a88;
  float *local_a80;
  double local_a78;
  float *local_a70;
  double local_a68;
  float *local_a60;
  double local_a58;
  float *local_a50;
  double local_a48;
  float *local_a40;
  double local_a38;
  float *local_a30;
  double local_a28;
  float *local_a20;
  undefined8 local_a18;
  uint local_a10;
  uint local_a0c;
  float *local_a08;
  uint local_9fc;
  uint local_9f8;
  uint local_9f4;
  uint local_9f0;
  uint local_9ec;
  uint local_9e8;
  uint local_9e4;
  uint local_9e0;
  uint local_9dc;
  uint local_9d8;
  uint local_9d4;
  char *local_9d0;
  uint local_9c8;
  uint local_9c4;
  aiVector3t<float> *local_9c0;
  aiVector3t<float> *local_9b8;
  aiVector3t<float> *local_9b0;
  aiMemoryInfo *local_9a8;
  aiScene *local_9a0;
  char *local_998;
  allocator<char> *local_990;
  allocator<char> local_981;
  string local_980;
  uint local_95c;
  uint local_958;
  uint i_4;
  uint idx;
  uint type;
  aiString name_1;
  uint i_3;
  aiString name;
  uint i_2;
  uint total;
  uint ptypes;
  aiMesh *mesh;
  undefined1 local_128 [4];
  uint i_1;
  undefined1 local_108 [8];
  aiVector3D special_points [3];
  aiMemoryInfo mem;
  aiScene *scene;
  ImportData import;
  uint i;
  bool silent;
  bool verbose;
  bool raw;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string in;
  uint num_local;
  char **params_local;
  
  in.field_2._12_4_ = num;
  iVar5 = strcmp(*params,"-h");
  if (((iVar5 == 0) || (iVar5 = strcmp(*params,"--help"), iVar5 == 0)) ||
     (iVar5 = strcmp(*params,"-?"), iVar5 == 0)) {
    printf("%s",AICMD_MSG_INFO_HELP_E);
    params_local._4_4_ = 0;
  }
  else if (in.field_2._12_4_ == 0) {
    printf("assimp info: Invalid number of arguments. See \'assimp info --help\'\n");
    params_local._4_4_ = 1;
  }
  else {
    local_998 = *params;
    local_990 = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_68,local_998,local_990);
    std::allocator<char>::~allocator(&local_69);
    bVar4 = false;
    verbose_00 = false;
    bVar3 = false;
    for (import._44_4_ = 1; (uint)import._44_4_ < (uint)in.field_2._12_4_;
        import._44_4_ = import._44_4_ + 1) {
      iVar5 = strcmp(params[(uint)import._44_4_],"--raw");
      if ((iVar5 == 0) || (iVar5 = strcmp(params[(uint)import._44_4_],"-r"), iVar5 == 0)) {
        bVar4 = true;
      }
      iVar5 = strcmp(params[(uint)import._44_4_],"--verbose");
      if ((iVar5 == 0) || (iVar5 = strcmp(params[(uint)import._44_4_],"-v"), iVar5 == 0)) {
        verbose_00 = true;
      }
      iVar5 = strcmp(params[(uint)import._44_4_],"--silent");
      if ((iVar5 == 0) || (iVar5 = strcmp(params[(uint)import._44_4_],"-s"), iVar5 == 0)) {
        bVar3 = true;
      }
    }
    if ((verbose_00 == false) || (!bVar3)) {
      ImportData::ImportData((ImportData *)&scene);
      if ((!bVar4) &&
         (ProcessStandardArguments((ImportData *)&scene,params + 1,in.field_2._12_4_ - 1),
         (int)scene == 0)) {
        scene._0_4_ = 0x379ecb;
      }
      scene_00 = ImportModel((ImportData *)&scene,(string *)local_68);
      local_9a0 = scene_00;
      if (scene_00 == (aiScene *)0x0) {
        uVar6 = std::__cxx11::string::c_str();
        printf("assimp info: Unable to load input file %s\n",uVar6);
        params_local._4_4_ = 5;
      }
      else {
        local_9a8 = (aiMemoryInfo *)&special_points[2].z;
        aiMemoryInfo::aiMemoryInfo(local_9a8);
        Assimp::Importer::GetMemoryRequirements(globalImporter,local_9a8);
        local_9b0 = (aiVector3t<float> *)local_108;
        local_9b8 = (aiVector3t<float> *)&special_points[2].y;
        do {
          local_9c0 = local_9b0;
          aiVector3t<float>::aiVector3t(local_9b0);
          local_9b0 = local_9c0 + 1;
        } while (local_9b0 != local_9b8);
        FindSpecialPoints(scene_00,(aiVector3D *)local_108);
        local_9d0 = Assimp_Info::format_string;
        local_9c8 = mem.cameras;
        local_9c4 = CountNodes(scene_00->mRootNode);
        local_9d4 = GetMaxDepth(scene_00->mRootNode);
        local_9fc = scene_00->mNumMeshes;
        local_9f8 = scene_00->mNumMaterials;
        local_9f4 = scene_00->mNumAnimations;
        local_9f0 = scene_00->mNumTextures;
        local_9ec = scene_00->mNumCameras;
        local_9e8 = scene_00->mNumLights;
        local_9e4 = CountVertices(scene_00);
        local_9e0 = CountFaces(scene_00);
        local_9dc = CountBones(scene_00);
        local_9d8 = CountAnimChannels(scene_00);
        FindPTypes_abi_cxx11_((string *)local_128,scene_00);
        local_a18 = std::__cxx11::string::c_str();
        local_a10 = GetAvgFacePerMesh(scene_00);
        local_a0c = GetAvgVertsPerMesh(scene_00);
        local_a08 = aiVector3t<float>::operator[]((aiVector3t<float> *)local_108,0);
        local_a28 = (double)*local_a08;
        local_a20 = aiVector3t<float>::operator[]((aiVector3t<float> *)local_108,1);
        local_a38 = (double)*local_a20;
        local_a30 = aiVector3t<float>::operator[]((aiVector3t<float> *)local_108,2);
        local_a48 = (double)*local_a30;
        local_a40 = aiVector3t<float>::operator[]((aiVector3t<float> *)&special_points[0].y,0);
        local_a58 = (double)*local_a40;
        local_a50 = aiVector3t<float>::operator[]((aiVector3t<float> *)&special_points[0].y,1);
        local_a68 = (double)*local_a50;
        local_a60 = aiVector3t<float>::operator[]((aiVector3t<float> *)&special_points[0].y,2);
        local_a78 = (double)*local_a60;
        local_a70 = aiVector3t<float>::operator[]((aiVector3t<float> *)&special_points[1].y,0);
        local_a88 = (double)*local_a70;
        local_a80 = aiVector3t<float>::operator[]((aiVector3t<float> *)&special_points[1].y,1);
        local_a98 = (double)*local_a80;
        local_a90 = aiVector3t<float>::operator[]((aiVector3t<float> *)&special_points[1].y,2);
        local_ae0 = (double)*local_a90;
        local_ae8 = local_a0c;
        local_af0 = local_a10;
        local_af8 = local_a18;
        local_b00 = local_9d8;
        local_b08 = local_9dc;
        local_b10 = local_9e0;
        local_b18 = local_9e4;
        local_b20 = local_9e8;
        local_b28 = local_9ec;
        local_b30 = local_9f8;
        local_b38[0] = local_9f0;
        local_aa0 = (undefined1 *)local_b38;
        printf(local_9d0,local_a28,local_a38,local_a48,local_a58,local_a68,local_a78,local_a88,
               local_a98,(ulong)local_9c8,(ulong)local_9c4,(ulong)local_9d4,(ulong)local_9fc,
               (ulong)local_9f4);
        std::__cxx11::string::~string((string *)local_128);
        if (bVar3) {
          printf("\n");
          params_local._4_4_ = 0;
        }
        else {
          if (scene_00->mNumMeshes != 0) {
            printf("\nMeshes:  (name) [vertices / bones / faces | primitive_types]\n");
          }
          for (mesh._4_4_ = 0; mesh._4_4_ < scene_00->mNumMeshes; mesh._4_4_ = mesh._4_4_ + 1) {
            paVar2 = scene_00->mMeshes[mesh._4_4_];
            local_aac = mesh._4_4_;
            local_aa8 = aiString::C_Str(&paVar2->mName);
            printf("    %d (%s)",(ulong)local_aac,local_aa8);
            printf(": [%d / %d / %d |",(ulong)paVar2->mNumVertices,(ulong)paVar2->mNumBones,
                   (ulong)paVar2->mNumFaces);
            uVar1 = paVar2->mPrimitiveTypes;
            if ((uVar1 & 1) != 0) {
              printf(" point");
            }
            if ((uVar1 & 2) != 0) {
              printf(" line");
            }
            if ((uVar1 & 4) != 0) {
              printf(" triangle");
            }
            if ((uVar1 & 8) != 0) {
              printf(" polygon");
            }
            printf("]\n");
          }
          name.data[0x3fc] = '\0';
          name.data[0x3fd] = '\0';
          name.data[0x3fe] = '\0';
          name.data[0x3ff] = '\0';
          name.data[0x3f8] = '\0';
          name.data[0x3f9] = '\0';
          name.data[0x3fa] = '\0';
          name.data[0x3fb] = '\0';
          for (; (uint)name.data._1016_4_ < scene_00->mNumMaterials;
              name.data._1016_4_ = name.data._1016_4_ + 1) {
            local_ab8 = (aiString *)(name_1.data + 0x3fc);
            aiString::aiString(local_ab8);
            local_ab0 = aiGetMaterialString(scene_00->mMaterials[(uint)name.data._1016_4_],
                                            "?mat.name",0,0,local_ab8);
            if (local_ab0 == aiReturn_SUCCESS) {
              pcVar7 = "\nNamed Materials:";
              if (name.data._1020_4_ != 0) {
                pcVar7 = "";
              }
              name.data._1020_4_ = name.data._1020_4_ + 1;
              printf("%s\n    \'%s\'",pcVar7,&i_3);
            }
          }
          if (name.data._1020_4_ != 0) {
            printf("\n");
          }
          name.data[0x3fc] = '\0';
          name.data[0x3fd] = '\0';
          name.data[0x3fe] = '\0';
          name.data[0x3ff] = '\0';
          name_1.data[0x3f8] = '\0';
          name_1.data[0x3f9] = '\0';
          name_1.data[0x3fa] = '\0';
          name_1.data[0x3fb] = '\0';
          for (; (uint)name_1.data._1016_4_ < scene_00->mNumMaterials;
              name_1.data._1016_4_ = name_1.data._1016_4_ + 1) {
            aiString::aiString((aiString *)&idx);
            for (i_4 = 0; i_4 < 0xd; i_4 = i_4 + 1) {
              local_958 = 0;
              while (local_abc = aiGetMaterialString(scene_00->mMaterials
                                                     [(uint)name_1.data._1016_4_],"$tex.file",
                                                     Assimp_Info::types[i_4],local_958,
                                                     (aiString *)&idx),
                    local_abc == aiReturn_SUCCESS) {
                pcVar7 = "\nTexture Refs:";
                if (name.data._1020_4_ != 0) {
                  pcVar7 = "";
                }
                name.data._1020_4_ = name.data._1020_4_ + 1;
                printf("%s\n    \'%s\'",pcVar7,&type);
                local_958 = local_958 + 1;
              }
            }
          }
          if (name.data._1020_4_ != 0) {
            printf("\n");
          }
          name.data[0x3fc] = '\0';
          name.data[0x3fd] = '\0';
          name.data[0x3fe] = '\0';
          name.data[0x3ff] = '\0';
          for (local_95c = 0; local_95c < scene_00->mNumAnimations; local_95c = local_95c + 1) {
            if ((scene_00->mAnimations[local_95c]->mName).length != 0) {
              pcVar7 = "\nNamed Animations:";
              if (name.data._1020_4_ != 0) {
                pcVar7 = "";
              }
              name.data._1020_4_ = name.data._1020_4_ + 1;
              printf("%s\n     \'%s\'",pcVar7,(scene_00->mAnimations[local_95c]->mName).data);
            }
          }
          if (name.data._1020_4_ != 0) {
            printf("\n");
          }
          printf("\nNode hierarchy:\n");
          local_ad0 = scene_00->mRootNode;
          local_ac8 = &local_981;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_980,"",local_ac8);
          PrintHierarchy(local_ad0,&local_980,verbose_00,false,true);
          std::__cxx11::string::~string((string *)&local_980);
          std::allocator<char>::~allocator(&local_981);
          printf("\n");
          params_local._4_4_ = 0;
        }
      }
      import.verbose = true;
      import.log = false;
      import._42_2_ = 0;
      ImportData::~ImportData((ImportData *)&scene);
    }
    else {
      printf("assimp info: Invalid arguments, verbose and silent at the same time are forbitten. ");
      params_local._4_4_ = 1;
      import.verbose = true;
      import.log = false;
      import._42_2_ = 0;
    }
    std::__cxx11::string::~string((string *)local_68);
  }
  return params_local._4_4_;
}

Assistant:

int Assimp_Info (const char* const* params, unsigned int num) {
	// --help
	if (!strcmp( params[0],"-h")||!strcmp( params[0],"--help")||!strcmp( params[0],"-?") ) {
		printf("%s",AICMD_MSG_INFO_HELP_E);
		return 0;
	}

	// asssimp info <file> [-r]
	if (num < 1) {
		printf("assimp info: Invalid number of arguments. "
			"See \'assimp info --help\'\n");
		return 1;
	}

	const std::string in  = std::string(params[0]);

	// get -r and -v arguments
	bool raw = false;
	bool verbose = false;
	bool silent = false;
	for(unsigned int i = 1; i < num; ++i) {
		if (!strcmp(params[i],"--raw")||!strcmp(params[i],"-r")) {
			raw = true;
		}
		if (!strcmp(params[i],"--verbose")||!strcmp(params[i],"-v")) {
			verbose = true;
		}
		if (!strcmp(params[i], "--silent") || !strcmp(params[i], "-s")) {
			silent = true;
		}
	}

	// Verbose and silent at the same time are not allowed
	if ( verbose && silent ) {
		printf("assimp info: Invalid arguments, verbose and silent at the same time are forbitten. ");
		return 1;
	}
	
	// Parse post-processing flags unless -r was specified
	ImportData import;
	if (!raw) {
		// get import flags
		ProcessStandardArguments(import, params + 1, num - 1);

		//No custom post process flags defined, we set all the post process flags active
		if(import.ppFlags == 0)
			import.ppFlags |= aiProcessPreset_TargetRealtime_MaxQuality;
	}

	// import the main model
	const aiScene* scene = ImportModel(import,in);
	if (!scene) {
		printf("assimp info: Unable to load input file %s\n",
			in.c_str());
		return 5;
	}

	aiMemoryInfo mem;
	globalImporter->GetMemoryRequirements(mem);


	static const char* format_string =
		"Memory consumption: %i B\n"
		"Nodes:              %i\n"
		"Maximum depth       %i\n"
		"Meshes:             %i\n"
		"Animations:         %i\n"
		"Textures (embed.):  %i\n"
		"Materials:          %i\n"
		"Cameras:            %i\n"
		"Lights:             %i\n"
		"Vertices:           %i\n"
		"Faces:              %i\n"
		"Bones:              %i\n"
		"Animation Channels: %i\n"
		"Primitive Types:    %s\n"
		"Average faces/mesh  %i\n"
		"Average verts/mesh  %i\n"
		"Minimum point      (%f %f %f)\n"
		"Maximum point      (%f %f %f)\n"
		"Center point       (%f %f %f)\n"

		;

	aiVector3D special_points[3];
	FindSpecialPoints(scene,special_points);
	printf(format_string,
		mem.total,
		CountNodes(scene->mRootNode),
		GetMaxDepth(scene->mRootNode),
		scene->mNumMeshes,
		scene->mNumAnimations,
		scene->mNumTextures,
		scene->mNumMaterials,
		scene->mNumCameras,
		scene->mNumLights,
		CountVertices(scene),
		CountFaces(scene),
		CountBones(scene),
		CountAnimChannels(scene),
		FindPTypes(scene).c_str(),
		GetAvgFacePerMesh(scene),
		GetAvgVertsPerMesh(scene),
		special_points[0][0],special_points[0][1],special_points[0][2],
		special_points[1][0],special_points[1][1],special_points[1][2],
		special_points[2][0],special_points[2][1],special_points[2][2]
		)
	;

	if (silent)
	{
		printf("\n");
		return 0;
	}

	// meshes
	if (scene->mNumMeshes) {
		printf("\nMeshes:  (name) [vertices / bones / faces | primitive_types]\n");
	}
	for (unsigned int i = 0; i < scene->mNumMeshes; ++i) {
		const aiMesh* mesh = scene->mMeshes[i];
		printf("    %d (%s)", i, mesh->mName.C_Str());
		printf(
			": [%d / %d / %d |",
			mesh->mNumVertices,
			mesh->mNumBones,
			mesh->mNumFaces
		);
		const unsigned int ptypes = mesh->mPrimitiveTypes;
		if (ptypes & aiPrimitiveType_POINT) { printf(" point"); }
		if (ptypes & aiPrimitiveType_LINE) { printf(" line"); }
		if (ptypes & aiPrimitiveType_TRIANGLE) { printf(" triangle"); }
		if (ptypes & aiPrimitiveType_POLYGON) { printf(" polygon"); }
		printf("]\n");
	}

	// materials
	unsigned int total=0;
	for(unsigned int i = 0;i < scene->mNumMaterials; ++i) {
		aiString name;
		if (AI_SUCCESS==aiGetMaterialString(scene->mMaterials[i],AI_MATKEY_NAME,&name)) {
			printf("%s\n    \'%s\'",(total++?"":"\nNamed Materials:" ),name.data);
		}
	}
	if(total) {
		printf("\n");
	}

	// textures
	total=0;
	for(unsigned int i = 0;i < scene->mNumMaterials; ++i) {
		aiString name;
		static const aiTextureType types[] = {
			aiTextureType_NONE,
			aiTextureType_DIFFUSE,
			aiTextureType_SPECULAR,
			aiTextureType_AMBIENT,
			aiTextureType_EMISSIVE,
			aiTextureType_HEIGHT,
			aiTextureType_NORMALS,
			aiTextureType_SHININESS,
			aiTextureType_OPACITY,
			aiTextureType_DISPLACEMENT,
			aiTextureType_LIGHTMAP,
			aiTextureType_REFLECTION,
			aiTextureType_UNKNOWN
		};
		for(unsigned int type = 0; type < sizeof(types)/sizeof(types[0]); ++type) {
			for(unsigned int idx = 0;AI_SUCCESS==aiGetMaterialString(scene->mMaterials[i],
				AI_MATKEY_TEXTURE(types[type],idx),&name); ++idx) {
				printf("%s\n    \'%s\'",(total++?"":"\nTexture Refs:" ),name.data);
			}
		}
	}
	if(total) {
		printf("\n");
	}

	// animations
	total=0;
	for(unsigned int i = 0;i < scene->mNumAnimations; ++i) {
		if (scene->mAnimations[i]->mName.length) {
			printf("%s\n     \'%s\'",(total++?"":"\nNamed Animations:" ),scene->mAnimations[i]->mName.data);
		}
	}
	if(total) {
		printf("\n");
	}

	// node hierarchy
	printf("\nNode hierarchy:\n");
	PrintHierarchy(scene->mRootNode,"",verbose);

	printf("\n");
	return 0;
}